

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O0

bool __thiscall
re2::Prog::SearchBitState
          (Prog *this,StringPiece *text,StringPiece *context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  bool bVar1;
  const_iterator pcVar2;
  const_iterator pcVar3;
  undefined4 in_ECX;
  undefined8 in_RDX;
  StringPiece *in_RSI;
  StringPiece *in_RDI;
  int in_R8D;
  DFA *in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  bool longest;
  bool anchored;
  BitState b;
  StringPiece sp0;
  BitState *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  undefined1 local_b8 [120];
  undefined1 local_40 [24];
  undefined2 uVar4;
  undefined7 in_stack_fffffffffffffff8;
  uint8_t in_stack_ffffffffffffffff;
  byte bVar5;
  
  uVar4 = (undefined2)((ulong)in_RDX >> 0x30);
  local_40._16_8_ = in_R9;
  StringPiece::StringPiece((StringPiece *)local_40);
  if ((in_R8D == 2) &&
     (in_ECX._0_1_ = '\x01', in_ECX._1_1_ = '\0', in_ECX._2_1_ = '\0', in_ECX._3_1_ = '\0',
     in_stack_00000008 < 1)) {
    local_40._16_8_ = local_40;
  }
  BitState::BitState((BitState *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                     (Prog *)local_b8);
  bVar1 = BitState::Search((BitState *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                           ,in_RDI,in_RSI,SUB21(uVar4,1),SUB21(uVar4,0),
                           (StringPiece *)CONCAT44(in_ECX,in_R8D),in_stack_00000010);
  if (bVar1) {
    if (in_R8D == 2) {
      pcVar2 = StringPiece::end((StringPiece *)local_40._16_8_);
      pcVar3 = StringPiece::end(in_RSI);
      if (pcVar2 != pcVar3) {
        bVar5 = 0;
        goto LAB_002334f5;
      }
    }
    bVar5 = 1;
  }
  else {
    bVar5 = 0;
  }
LAB_002334f5:
  BitState::~BitState(in_stack_ffffffffffffff00);
  return (bool)(bVar5 & 1);
}

Assistant:

bool Prog::SearchBitState(const StringPiece& text,
                          const StringPiece& context,
                          Anchor anchor,
                          MatchKind kind,
                          StringPiece* match,
                          int nmatch) {
  // If full match, we ask for an anchored longest match
  // and then check that match[0] == text.
  // So make sure match[0] exists.
  StringPiece sp0;
  if (kind == kFullMatch) {
    anchor = kAnchored;
    if (nmatch < 1) {
      match = &sp0;
      nmatch = 1;
    }
  }

  // Run the search.
  BitState b(this);
  bool anchored = anchor == kAnchored;
  bool longest = kind != kFirstMatch;
  if (!b.Search(text, context, anchored, longest, match, nmatch))
    return false;
  if (kind == kFullMatch && match[0].end() != text.end())
    return false;
  return true;
}